

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O0

int mbedtls_internal_aes_decrypt(mbedtls_aes_context *ctx,uchar *input,uchar *output)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint *puVar6;
  uint local_50;
  uint local_4c;
  anon_struct_32_2_94737341 t;
  uint32_t *RK;
  int i;
  uchar *output_local;
  uchar *input_local;
  mbedtls_aes_context *ctx_local;
  
  t.Y._8_8_ = ctx->buf + ctx->rk_offset;
  uVar1 = mbedtls_get_unaligned_uint32(input);
  local_50 = *(uint *)t.Y._8_8_ ^ uVar1;
  t.Y._8_8_ = t.Y._8_8_ + 4;
  uVar1 = mbedtls_get_unaligned_uint32(input + 4);
  local_4c = *(uint *)t.Y._8_8_ ^ uVar1;
  t.Y._8_8_ = t.Y._8_8_ + 4;
  uVar1 = mbedtls_get_unaligned_uint32(input + 8);
  t.X[0] = *(uint *)t.Y._8_8_ ^ uVar1;
  t.Y._8_8_ = t.Y._8_8_ + 4;
  uVar1 = mbedtls_get_unaligned_uint32(input + 0xc);
  t.X[1] = *(uint *)t.Y._8_8_ ^ uVar1;
  RK._4_4_ = ctx->nr >> 1;
  t.Y._8_8_ = t.Y._8_8_ + 4;
  while (RK._4_4_ = RK._4_4_ + -1, 0 < RK._4_4_) {
    uVar2 = *(uint *)t.Y._8_8_ ^ RT0[local_50 & 0xff] ^ RT1[t.X[1] >> 8 & 0xff] ^
            RT2[t.X[0] >> 0x10 & 0xff] ^ RT3[local_4c >> 0x18];
    uVar3 = *(uint *)(t.Y._8_8_ + 4) ^ RT0[local_4c & 0xff] ^ RT1[local_50 >> 8 & 0xff] ^
            RT2[t.X[1] >> 0x10 & 0xff] ^ RT3[t.X[0] >> 0x18];
    uVar4 = *(uint *)(t.Y._8_8_ + 8) ^ RT0[t.X[0] & 0xff] ^ RT1[local_4c >> 8 & 0xff] ^
            RT2[local_50 >> 0x10 & 0xff] ^ RT3[t.X[1] >> 0x18];
    uVar5 = *(uint *)(t.Y._8_8_ + 0xc) ^ RT0[t.X[1] & 0xff] ^ RT1[t.X[0] >> 8 & 0xff] ^
            RT2[local_4c >> 0x10 & 0xff] ^ RT3[local_50 >> 0x18];
    local_50 = *(uint *)(t.Y._8_8_ + 0x10) ^ RT0[uVar2 & 0xff] ^ RT1[uVar5 >> 8 & 0xff] ^
               RT2[uVar4 >> 0x10 & 0xff] ^ RT3[uVar3 >> 0x18];
    local_4c = *(uint *)(t.Y._8_8_ + 0x14) ^ RT0[uVar3 & 0xff] ^ RT1[uVar2 >> 8 & 0xff] ^
               RT2[uVar5 >> 0x10 & 0xff] ^ RT3[uVar4 >> 0x18];
    puVar6 = (uint *)(t.Y._8_8_ + 0x1c);
    t.X[0] = *(uint *)(t.Y._8_8_ + 0x18) ^ RT0[uVar4 & 0xff] ^ RT1[uVar3 >> 8 & 0xff] ^
             RT2[uVar2 >> 0x10 & 0xff] ^ RT3[uVar5 >> 0x18];
    t.Y._8_8_ = t.Y._8_8_ + 0x20;
    t.X[1] = *puVar6 ^ RT0[uVar5 & 0xff] ^ RT1[uVar4 >> 8 & 0xff] ^ RT2[uVar3 >> 0x10 & 0xff] ^
             RT3[uVar2 >> 0x18];
  }
  t.X[2] = *(uint *)t.Y._8_8_ ^ RT0[local_50 & 0xff] ^ RT1[t.X[1] >> 8 & 0xff] ^
           RT2[t.X[0] >> 0x10 & 0xff] ^ RT3[local_4c >> 0x18];
  t.X[3] = *(uint *)(t.Y._8_8_ + 4) ^ RT0[local_4c & 0xff] ^ RT1[local_50 >> 8 & 0xff] ^
           RT2[t.X[1] >> 0x10 & 0xff] ^ RT3[t.X[0] >> 0x18];
  t.Y[0] = *(uint *)(t.Y._8_8_ + 8) ^ RT0[t.X[0] & 0xff] ^ RT1[local_4c >> 8 & 0xff] ^
           RT2[local_50 >> 0x10 & 0xff] ^ RT3[t.X[1] >> 0x18];
  t.Y[1] = *(uint *)(t.Y._8_8_ + 0xc) ^ RT0[t.X[1] & 0xff] ^ RT1[t.X[0] >> 8 & 0xff] ^
           RT2[local_4c >> 0x10 & 0xff] ^ RT3[local_50 >> 0x18];
  local_50 = *(uint *)(t.Y._8_8_ + 0x10) ^ (uint)RSb[t.X[2] & 0xff] ^
             (uint)RSb[t.Y[1] >> 8 & 0xff] << 8 ^ (uint)RSb[t.Y[0] >> 0x10 & 0xff] << 0x10 ^
             (uint)RSb[t.X[3] >> 0x18] << 0x18;
  local_4c = *(uint *)(t.Y._8_8_ + 0x14) ^ (uint)RSb[t.X[3] & 0xff] ^
             (uint)RSb[t.X[2] >> 8 & 0xff] << 8 ^ (uint)RSb[t.Y[1] >> 0x10 & 0xff] << 0x10 ^
             (uint)RSb[t.Y[0] >> 0x18] << 0x18;
  puVar6 = (uint *)(t.Y._8_8_ + 0x1c);
  t.X[0] = *(uint *)(t.Y._8_8_ + 0x18) ^ (uint)RSb[t.Y[0] & 0xff] ^
           (uint)RSb[t.X[3] >> 8 & 0xff] << 8 ^ (uint)RSb[t.X[2] >> 0x10 & 0xff] << 0x10 ^
           (uint)RSb[t.Y[1] >> 0x18] << 0x18;
  t.Y._8_8_ = t.Y._8_8_ + 0x20;
  t.X[1] = *puVar6 ^ (uint)RSb[t.Y[1] & 0xff] ^ (uint)RSb[t.Y[0] >> 8 & 0xff] << 8 ^
           (uint)RSb[t.X[3] >> 0x10 & 0xff] << 0x10 ^ (uint)RSb[t.X[2] >> 0x18] << 0x18;
  mbedtls_put_unaligned_uint32(output,local_50);
  mbedtls_put_unaligned_uint32(output + 4,local_4c);
  mbedtls_put_unaligned_uint32(output + 8,t.X[0]);
  mbedtls_put_unaligned_uint32(output + 0xc,t.X[1]);
  mbedtls_platform_zeroize(&local_50,0x20);
  return 0;
}

Assistant:

int mbedtls_internal_aes_decrypt(mbedtls_aes_context *ctx,
                                 const unsigned char input[16],
                                 unsigned char output[16])
{
    int i;
    uint32_t *RK = ctx->buf + ctx->rk_offset;
    struct {
        uint32_t X[4];
        uint32_t Y[4];
    } t;

    t.X[0] = MBEDTLS_GET_UINT32_LE(input,  0); t.X[0] ^= *RK++;
    t.X[1] = MBEDTLS_GET_UINT32_LE(input,  4); t.X[1] ^= *RK++;
    t.X[2] = MBEDTLS_GET_UINT32_LE(input,  8); t.X[2] ^= *RK++;
    t.X[3] = MBEDTLS_GET_UINT32_LE(input, 12); t.X[3] ^= *RK++;

    for (i = (ctx->nr >> 1) - 1; i > 0; i--) {
        AES_RROUND(t.Y[0], t.Y[1], t.Y[2], t.Y[3], t.X[0], t.X[1], t.X[2], t.X[3]);
        AES_RROUND(t.X[0], t.X[1], t.X[2], t.X[3], t.Y[0], t.Y[1], t.Y[2], t.Y[3]);
    }

    AES_RROUND(t.Y[0], t.Y[1], t.Y[2], t.Y[3], t.X[0], t.X[1], t.X[2], t.X[3]);

    t.X[0] = *RK++ ^ \
             ((uint32_t) RSb[MBEDTLS_BYTE_0(t.Y[0])]) ^
             ((uint32_t) RSb[MBEDTLS_BYTE_1(t.Y[3])] <<  8) ^
             ((uint32_t) RSb[MBEDTLS_BYTE_2(t.Y[2])] << 16) ^
             ((uint32_t) RSb[MBEDTLS_BYTE_3(t.Y[1])] << 24);

    t.X[1] = *RK++ ^ \
             ((uint32_t) RSb[MBEDTLS_BYTE_0(t.Y[1])]) ^
             ((uint32_t) RSb[MBEDTLS_BYTE_1(t.Y[0])] <<  8) ^
             ((uint32_t) RSb[MBEDTLS_BYTE_2(t.Y[3])] << 16) ^
             ((uint32_t) RSb[MBEDTLS_BYTE_3(t.Y[2])] << 24);

    t.X[2] = *RK++ ^ \
             ((uint32_t) RSb[MBEDTLS_BYTE_0(t.Y[2])]) ^
             ((uint32_t) RSb[MBEDTLS_BYTE_1(t.Y[1])] <<  8) ^
             ((uint32_t) RSb[MBEDTLS_BYTE_2(t.Y[0])] << 16) ^
             ((uint32_t) RSb[MBEDTLS_BYTE_3(t.Y[3])] << 24);

    t.X[3] = *RK++ ^ \
             ((uint32_t) RSb[MBEDTLS_BYTE_0(t.Y[3])]) ^
             ((uint32_t) RSb[MBEDTLS_BYTE_1(t.Y[2])] <<  8) ^
             ((uint32_t) RSb[MBEDTLS_BYTE_2(t.Y[1])] << 16) ^
             ((uint32_t) RSb[MBEDTLS_BYTE_3(t.Y[0])] << 24);

    MBEDTLS_PUT_UINT32_LE(t.X[0], output,  0);
    MBEDTLS_PUT_UINT32_LE(t.X[1], output,  4);
    MBEDTLS_PUT_UINT32_LE(t.X[2], output,  8);
    MBEDTLS_PUT_UINT32_LE(t.X[3], output, 12);

    mbedtls_platform_zeroize(&t, sizeof(t));

    return 0;
}